

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama.cpp
# Opt level: O2

int llama_split_prefix(char *split_prefix,size_t maxlen,char *split_path,int split_no,
                      int split_count)

{
  long lVar1;
  uint uVar2;
  ulong __maxlen;
  uint uVar3;
  allocator<char> local_a1;
  char *local_a0;
  string str_split_path;
  string str_postfix;
  char postfix [32];
  
  local_a0 = split_prefix;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&str_split_path,split_path,(allocator<char> *)postfix);
  snprintf(postfix,0x20,"-%05d-of-%05d.gguf",(ulong)(split_no + 1),(ulong)(uint)split_count);
  std::__cxx11::string::string<std::allocator<char>>((string *)&str_postfix,postfix,&local_a1);
  uVar3 = (int)str_split_path._M_string_length - (int)str_postfix._M_string_length;
  uVar2 = 0;
  if (0 < (int)uVar3) {
    lVar1 = std::__cxx11::string::find((string *)&str_split_path,(ulong)&str_postfix);
    if (lVar1 != -1) {
      __maxlen = (ulong)(uVar3 & 0x7fffffff) + 1;
      if (maxlen <= __maxlen) {
        __maxlen = maxlen;
      }
      snprintf(local_a0,__maxlen,"%s",split_path);
      uVar2 = uVar3;
    }
  }
  std::__cxx11::string::~string((string *)&str_postfix);
  std::__cxx11::string::~string((string *)&str_split_path);
  return uVar2;
}

Assistant:

int llama_split_prefix(char * split_prefix, size_t maxlen, const char * split_path, int split_no, int split_count) {
    std::string str_split_path(split_path);
    char postfix[32];
    snprintf(postfix, 32, "-%05d-of-%05d.gguf", split_no + 1, split_count);
    std::string str_postfix(postfix);

    // check if split_prefix ends with postfix
    int size_prefix = str_split_path.size() - str_postfix.size();
    if (size_prefix > 0 && str_split_path.find(str_postfix, size_prefix) != std::string::npos) {
        snprintf(split_prefix, std::min((size_t) size_prefix + 1, maxlen), "%s", split_path);
        return size_prefix;
    }

    return 0;
}